

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_ext_gstate.c
# Opt level: O3

HPDF_BOOL HPDF_ExtGState_Validate(HPDF_ExtGState ext_gstate)

{
  if (ext_gstate != (HPDF_ExtGState)0x0) {
    return (HPDF_BOOL)(((ext_gstate->header).obj_class - 0xa11 & 0xfeff) == 0);
  }
  return 0;
}

Assistant:

HPDF_BOOL
HPDF_ExtGState_Validate  (HPDF_ExtGState  ext_gstate)
{
    if (!ext_gstate || (ext_gstate->header.obj_class != 
                (HPDF_OSUBCLASS_EXT_GSTATE | HPDF_OCLASS_DICT) &&
                ext_gstate->header.obj_class !=
                 (HPDF_OSUBCLASS_EXT_GSTATE_R | HPDF_OCLASS_DICT)))
        return HPDF_FALSE;

    return HPDF_TRUE;
}